

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this)

{
  PoolItem *pPVar1;
  pool_ptr<soul::heart::Block> local_10;
  
  pPVar1 = PoolAllocator::allocateSpaceForObject
                     (&((this->super_BlockBuilder).module)->allocator->pool,0x18);
  pPVar1->item = (void *)0x0;
  *(undefined8 *)&pPVar1->field_0x18 = 0;
  pPVar1[1].size = 0;
  pPVar1->item = &PTR__Object_00306678;
  pPVar1->destructor =
       PoolAllocator::allocate<soul::heart::ReturnVoid>::anon_class_1_0_00000001::__invoke;
  local_10.object = (Block *)0x0;
  addTerminatorStatement(this,(Terminator *)&pPVar1->item,&local_10);
  return;
}

Assistant:

void addReturn()
    {
        addTerminatorStatement (module.allocate<heart::ReturnVoid>(), nullptr);
    }